

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O1

int CVodeSetLinearSolutionScaling(void *cvode_mem,int onoff)

{
  int iVar1;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVLsMem local_18;
  CVodeMem local_10;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeSetLinearSolutionScaling",&local_10,&local_18);
  if (iVar1 == 0) {
    iVar1 = -3;
    if ((local_18->matrixbased != 0) && (local_10->cv_lmm == 2)) {
      local_18->scalesol = onoff;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int CVodeSetLinearSolutionScaling(void* cvode_mem, sunbooleantype onoff)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure; store input and return */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* check for valid solver and method type */
  if (!(cvls_mem->matrixbased) || cv_mem->cv_lmm != CV_BDF)
  {
    return (CVLS_ILL_INPUT);
  }

  /* set solution scaling flag */
  cvls_mem->scalesol = onoff;

  return (CVLS_SUCCESS);
}